

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O0

errr init_spoil(int argc,char **argv)

{
  _Bool _Var1;
  ulong uVar2;
  char *name;
  char local_458 [6];
  _Bool loaded_save;
  _Bool exists;
  char defname [1024];
  int j;
  unsigned_long val;
  char *valend;
  int increment;
  _Bool badarg;
  uint32_t specified_seed;
  _Bool have_specified_seed;
  char *randart_name;
  int local_20;
  int iStack_1c;
  _Bool load_randart;
  int result;
  int i;
  char **argv_local;
  int argc_local;
  
  iStack_1c = 1;
  local_20 = 0;
  randart_name._7_1_ = 0;
  _specified_seed = (char *)0x0;
  badarg = false;
  increment = 0;
  _result = argv;
  argv_local._0_4_ = argc;
  do {
    valend._7_1_ = 0;
    valend._0_4_ = 1;
    if ((int)argv_local <= iStack_1c) {
      if (local_20 == 0) {
        init_angband();
        if ((randart_name._7_1_ & 1) == 0) {
          _Var1 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
          if (!_Var1) {
            printf("init-spoil: could not initialize player.\n");
            local_20 = 1;
          }
        }
        else if ((_specified_seed == (char *)0x0) && ((badarg & 1U) == 0)) {
          safe_setuid_grab();
          _Var1 = file_exists(savefile);
          safe_setuid_drop();
          if (_Var1) {
            _Var1 = savefile_load(savefile,false);
            deactivate_randart_file();
            if (!_Var1) {
              printf("init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', failed to load.\n"
                     ,savefile);
              local_20 = 1;
            }
          }
          else {
            if (savefile[0] == '\0') {
              printf(
                    "init-spoil: using artifacts associated with a savefile, but main did not set the savefile.\n"
                    );
            }
            else {
              printf("init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', does not exist.\n"
                     ,savefile);
            }
            local_20 = 1;
          }
        }
        else {
          _Var1 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
          if (_Var1) {
            memset(local_458,0,0x400);
            deactivate_randart_file();
            name = option_name(0x1e);
            option_set(name,1);
            if (_specified_seed == (char *)0x0) {
              seed_randart = increment;
              do_randart(increment,true);
            }
            else {
              path_build(local_458,0x400,ANGBAND_DIR_USER,"randart.txt");
              _Var1 = copy_file(_specified_seed,local_458,FTYPE_TEXT);
              if (_Var1) {
                seed_randart = parse_seed(_specified_seed);
              }
              else {
                printf("init-spoil: could not copy randart file to \'%s\'.\n",local_458);
                local_20 = 1;
              }
            }
            if (local_20 == 0) {
              cleanup_parser(&artifact_parser);
              run_parser(&randart_parser);
              if (_specified_seed == (char *)0x0) {
                deactivate_randart_file();
              }
              else {
                file_delete(local_458);
              }
            }
          }
          else {
            printf("init-spoil: could not initialize player.\n");
            local_20 = 1;
          }
        }
        if (local_20 == 0) {
          flavor_set_all_aware();
          for (iStack_1c = 0; iStack_1c < 4; iStack_1c = iStack_1c + 1) {
            if ((opts[iStack_1c].enabled & 1U) != 0) {
              (*opts[iStack_1c].func)(opts[iStack_1c].path);
            }
          }
        }
        cleanup_angband();
        if (local_20 == 0) {
          exit(0);
        }
        argv_local._4_4_ = local_20;
      }
      else {
        argv_local._4_4_ = local_20;
      }
      return argv_local._4_4_;
    }
    if (*_result[iStack_1c] == '-') {
      if ((_result[iStack_1c][1] == 'p') && (_result[iStack_1c][2] == '\0')) {
        randart_name._7_1_ = 1;
        _specified_seed = (char *)0x0;
      }
      else if ((_result[iStack_1c][1] == 'r') && (_result[iStack_1c][2] == '\0')) {
        if (iStack_1c < (int)argv_local + -1) {
          randart_name._7_1_ = 1;
          _specified_seed = _result[iStack_1c + 1];
          valend._0_4_ = 2;
        }
        else {
          printf("init-spoil: \'%s\' requires an argument, the name of a randart file\n");
          local_20 = 1;
        }
      }
      else if ((_result[iStack_1c][1] == 's') && (_result[iStack_1c][2] == '\0')) {
        if (iStack_1c < (int)argv_local + -1) {
          uVar2 = strtoul(_result[iStack_1c + 1],(char **)&val,0x10);
          valend._0_4_ = (int)valend + 1;
          if (((*_result[iStack_1c + 1] == '\0') ||
              (_Var1 = contains_only_spaces((char *)val), !_Var1)) || (0xffffffff < uVar2)) {
            if (uVar2 < 0x100000000) {
              printf("init-spoil: \'%s\' requires an integer argument, the randart seed\n");
            }
            else {
              printf("init-spoil: seed is too large\n");
            }
            local_20 = 1;
          }
          else {
            randart_name._7_1_ = 1;
            badarg = true;
            increment = (int)uVar2;
          }
        }
        else {
          printf("init-spoil: \'%s\' requires an argument, the randart seed\n");
          local_20 = 1;
        }
      }
      else {
        defname[0x3fc] = '\0';
        defname[0x3fd] = '\0';
        defname[0x3fe] = '\0';
        defname[0x3ff] = '\0';
        for (; (int)defname._1020_4_ < 4; defname._1020_4_ = defname._1020_4_ + 1) {
          if ((_result[iStack_1c][1] == opts[(int)defname._1020_4_].letter) &&
             (_result[iStack_1c][2] == '\0')) {
            if (iStack_1c < (int)argv_local + -1) {
              opts[(int)defname._1020_4_].enabled = true;
              opts[(int)defname._1020_4_].path = _result[iStack_1c + 1];
              valend._0_4_ = 2;
            }
            else {
              printf("init-spoil: \'%s\' requires an argument, the name of the spoiler file\n");
              local_20 = 1;
            }
            goto LAB_0012dc9d;
          }
        }
        valend._7_1_ = 1;
      }
    }
    else {
      valend._7_1_ = 1;
    }
LAB_0012dc9d:
    if ((valend._7_1_ & 1) != 0) {
      printf("init-spoil: bad argument \'%s\'\n");
      local_20 = 1;
    }
    iStack_1c = (int)valend + iStack_1c;
  } while( true );
}

Assistant:

errr init_spoil(int argc, char *argv[]) {
	/* Skip over argv[0] */
	int i = 1;
	int result = 0;
	bool load_randart = false;
	const char *randart_name = NULL;
	bool have_specified_seed = false;
	uint32_t specified_seed = 0;

	/* Parse the arguments. */
	while (1) {
		bool badarg = false;
		int increment = 1;

		if (i >= argc) {
			break;
		}

		if (argv[i][0] == '-') {
			/* Try to match with a known option. */
			if (argv[i][1] == 'p' && argv[i][2] == '\0') {
				load_randart = true;
				randart_name = NULL;
			} else if (argv[i][1] == 'r' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					load_randart = true;
					/* Record the name; don't parse it. */
					randart_name = argv[i + 1];
					++increment;
				} else {
					printf("init-spoil: '%s' requires an argument, the name of a randart file\n", argv[i]);
					result = 1;
				}
			} else if (argv[i][1] == 's' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					char *valend;
					unsigned long val;

					val = strtoul(argv[i + 1], &valend, 16);
					++increment;
					if (argv[i + 1][0] != '\0'
							&& contains_only_spaces(valend)
							&& val <= 0xFFFFFFFFul) {
						load_randart = true;
						have_specified_seed = true;
						specified_seed = val;
					} else if (val > 0xFFFFFFFFul) {
						printf("init-spoil: seed is too large\n");
						result = 1;
					} else {
						printf("init-spoil: '%s' requires an integer argument, the randart seed\n",
							argv[i]);
						result = 1;
					}
				} else {
					printf("init-spoil: '%s' requires an argument, the randart seed\n", argv[i]);
					result = 1;
				}
			} else {
				int j = 0;

				while (1) {
					if (j >= (int)N_ELEMENTS(opts)) {
						badarg = true;
						break;
					}

					if (argv[i][1] == opts[j].letter &&
							argv[i][2] == '\0') {
						if (i < argc - 1) {
							opts[j].enabled = true;
							/*
							 * Record the filename
							 * and skip parsing
							 * of it.
							 */
							opts[j].path =
								argv[i + 1];
							++increment;
						} else {
							printf("init-spoil: '%s' requires an argument, the name of the spoiler file\n", argv[i]);
							result = 1;
						}
						break;
					}

					++j;
				}
			}
		} else {
			badarg = true;
		}

		if (badarg) {
			printf("init-spoil: bad argument '%s'\n", argv[i]);
			result = 1;
		}

		i += increment;
	}

	if (result != 0) return result;

	/* Generate the spoilers. */
	init_angband();

	if (load_randart) {
		if (randart_name || have_specified_seed) {
			if (player_make_simple(NULL, NULL, "Spoiler")) {
				char defname[1024] = "";

				deactivate_randart_file();
				option_set(option_name(OPT_birth_randarts),
					true);

				if (randart_name) {
					path_build(defname, sizeof(defname),
						ANGBAND_DIR_USER,
						"randart.txt");
					/*
					 * Copy rather than move in case the
					 * file supplied is read-only.
					 */
					if (copy_file(randart_name, defname,
							FTYPE_TEXT)) {
						seed_randart = parse_seed(randart_name);
					} else {
						printf("init-spoil: could not copy randart file to '%s'.\n", defname);
						result = 1;
					}
				} else {
					seed_randart = specified_seed;
					do_randart(seed_randart, true);
				}

				if (result == 0) {
					cleanup_parser(&artifact_parser);
					run_parser(&randart_parser);
					if (randart_name) {
						file_delete(defname);
					} else {
						deactivate_randart_file();
					}
				}
			} else {
				printf("init-spoil: could not initialize player.\n");
				result = 1;
			}
		} else {
			bool exists;

			safe_setuid_grab();
			exists = file_exists(savefile);
			safe_setuid_drop();
			if (exists) {
				bool loaded_save =
					savefile_load(savefile, false);

				deactivate_randart_file();
				if (!loaded_save) {
					printf("init-spoil: using artifacts "
						"associated with a savefile, "
						"but the savefile set by "
						"main, '%s', failed to load.\n",
						savefile);
					result = 1;
				}
			} else if (savefile[0]) {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but the savefile set "
					"by main, '%s', does not exist.\n",
					savefile);
				result = 1;
			} else {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but main did not set "
					"the savefile.\n");
				result = 1;
			}
		}
	} else if (!player_make_simple(NULL, NULL, "Spoiler")) {
		printf("init-spoil: could not initialize player.\n");
		result = 1;
	}

	if (result == 0) {
		flavor_set_all_aware();
		for (i = 0; i < (int)N_ELEMENTS(opts); ++i) {
			if (!opts[i].enabled) continue;
			(*(opts[i].func))(opts[i].path);
		}
	}

	cleanup_angband();

	if (result == 0) {
		exit(0);
	}

	return result;
}